

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

cf_bool_t cf_event_wait(cf_event_t *self,int timeout_ms)

{
  undefined1 local_28 [8];
  timespec ts;
  int error;
  int timeout_ms_local;
  cf_event_t *self_local;
  
  ts.tv_nsec._0_4_ = 0;
  local_28 = (undefined1  [8])(long)(timeout_ms / 1000);
  ts.tv_sec = (long)timeout_ms * 1000000;
  ts.tv_nsec._4_4_ = timeout_ms;
  pthread_mutex_lock((pthread_mutex_t *)&self->mutex);
  while (self->event_status == 0 && (int)ts.tv_nsec == 0) {
    if (ts.tv_nsec._4_4_ == -1) {
      ts.tv_nsec._0_4_ =
           pthread_cond_wait((pthread_cond_t *)&self->cond,(pthread_mutex_t *)&self->mutex);
    }
    else {
      ts.tv_nsec._0_4_ =
           pthread_cond_timedwait
                     ((pthread_cond_t *)&self->cond,(pthread_mutex_t *)&self->mutex,
                      (timespec *)local_28);
    }
  }
  if (((int)ts.tv_nsec == 0) && (self->manual_reset == 0)) {
    self->event_status = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&self->mutex);
  return (cf_bool_t)((int)ts.tv_nsec == 0);
}

Assistant:

cf_bool_t cf_event_wait(cf_event_t* self, int timeout_ms) {
#if defined(CF_OS_WIN)
    DWORD ms = timeout_ms == -1 ? INFINITE : timeout_ms;
    return (WaitForSingleObject(self->handle, ms) == WAIT_OBJECT_0);
#else
    int error = 0;
    struct timespec ts;
    ts.tv_sec = timeout_ms / 1000;
    ts.tv_nsec = CF_TYPE_CAST(cf_uint64_t, timeout_ms) * 1000000;
    pthread_mutex_lock(&self->mutex);
    while (!self->event_status && error == 0) { 
        if (timeout_ms == -1) {
            error = pthread_cond_wait(&self->cond, &self->mutex);
        } else {
            error = pthread_cond_timedwait(&self->cond, &self->mutex, &ts);
        }
    }
    if (error == 0 && !self->manual_reset) {
        self->event_status = CF_FALSE;
    }
    pthread_mutex_unlock(&self->mutex);
    return (error == 0);
#endif
}